

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  string content;
  ifstream ifs;
  undefined1 local_210 [216];
  undefined8 auStack_138 [36];
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ybb language interpreter V0.1");
    std::endl<char,std::char_traits<char>>(poVar2);
    _ifs = local_210;
    local_210[0] = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
  }
  else {
    std::ifstream::ifstream(&ifs,argv[1],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"File not found.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      content._M_dataplus._M_p = (pointer)&content.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&content,
                 *(undefined8 *)((long)auStack_138 + *(long *)((long)_ifs + -0x18)),
                 0xffffffffffffffff,0,0xffffffff);
      runProgram(&content);
      std::__cxx11::string::~string((string *)&content);
    }
    std::ifstream::~ifstream(&ifs);
  }
  return 0;
}

Assistant:

int main(int argc, const char*argv[]) {
    if (argc >= 2){
        std::ifstream ifs(argv[1]);
        if (ifs.is_open()) {
            std::string content((std::istreambuf_iterator<char>(ifs)),
                                (std::istreambuf_iterator<char>()));
            runProgram(content);
        } else{
            std::cout << "File not found." << std::endl;
        }
        return 0;
    }

    std::cout << "Ybb language interpreter V0.1" << std::endl;
    while (true){
        std::string code;
        getline(std::cin, code);
        if (code.empty())
            break;

        runProgram(code);
    }
    return 0;
}